

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

uint32_t window32(void *blob,int len,int start,int count)

{
  ulong uVar1;
  byte bVar2;
  sbyte sVar3;
  int iVar4;
  byte bVar6;
  int iVar7;
  int iVar5;
  
  iVar7 = len + 3;
  if (-1 < len) {
    iVar7 = len;
  }
  if (count == 0) {
    return 0;
  }
  uVar1 = (long)start % (long)(len << 3);
  iVar4 = (int)uVar1;
  iVar5 = iVar4 + 0x1f;
  if (-1 < iVar4) {
    iVar5 = iVar4;
  }
  iVar4 = iVar5 >> 5;
  bVar6 = (byte)count;
  if ((uVar1 & 0x1f) != 0) {
    bVar2 = (byte)uVar1 & 0x1f;
    sVar3 = (bVar6 < 0x21) * (' ' - bVar6);
    return ((*(uint *)((long)blob +
                      (long)(int)(CONCAT44(iVar5 >> 0x1f,iVar4) % (long)(iVar7 >> 2)) * 4) >> bVar2
            | *(int *)((long)blob + (long)((iVar4 + 1) % (iVar7 >> 2)) * 4) << 0x20 - bVar2) <<
           sVar3) >> sVar3;
  }
  sVar3 = (bVar6 < 0x21) * (' ' - bVar6);
  return (uint)(*(int *)((long)blob + (long)iVar4 * 4) << sVar3) >> sVar3;
}

Assistant:

uint32_t window32 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  assert((len & 3) == 0);

  int ndwords = len / 4;

  uint32_t * k = (uint32_t*)blob;

  if(count == 0) return 0;

  int c = start & (32-1);
  int d = start / 32;

  if(c == 0) return (k[d] & ((1 << count) - 1));

  int ia = (d + 1) % ndwords;
  int ib = (d + 0) % ndwords;

  uint32_t a = k[ia];
  uint32_t b = k[ib];

  uint32_t t = (a << (32-c)) | (b >> c);

  t &= ((1 << count)-1);

  return t;
}